

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles2::Functional::apiVarValueStr_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,VarValue *value)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint extraout_EDX;
  uint precision;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar4;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  string local_1c8;
  ostringstream result;
  
  uVar3 = glu::getDataTypeScalarSize(*(DataType *)this);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
  uVar4 = extraout_RDX;
  if (1 < (int)uVar3) {
    std::operator<<(&result.super_basic_ostream<char,_std::char_traits<char>_>,"(");
    uVar4 = extraout_RDX_00;
  }
  uVar6 = 0;
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = (ulong)uVar3;
  }
  lVar8 = 4;
  do {
    precision = (uint)uVar4;
    if (uVar5 == uVar6) {
      if (1 < (int)uVar3) {
        std::operator<<(&result.super_basic_ostream<char,_std::char_traits<char>_>,")");
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
      return __return_storage_ptr__;
    }
    if (uVar6 != 0) {
      std::operator<<(&result.super_basic_ostream<char,_std::char_traits<char>_>,", ");
      precision = extraout_EDX;
    }
    iVar2 = *(int *)this;
    if (iVar2 - 1U < 4) {
LAB_00ed52cd:
      de::floatToString_abi_cxx11_(&local_1c8,(de *)0x2,*(float *)(this + uVar6 * 4 + 4),precision);
      std::operator<<(&result.super_basic_ostream<char,_std::char_traits<char>_>,
                      (string *)&local_1c8);
LAB_00ed52ea:
      std::__cxx11::string::~string((string *)&local_1c8);
      uVar4 = extraout_RDX_01;
    }
    else {
      uVar1 = iVar2 - 0x12;
      precision = CONCAT31((int3)(uVar1 >> 8),8 < uVar1);
      uVar4 = (ulong)precision;
      if (iVar2 - 5U < 9 || 8 >= uVar1) goto LAB_00ed52cd;
      if (iVar2 - 0x1bU < 4) {
        de::toString<int>(&local_1c8,(int *)(this + lVar8));
        std::operator<<(&result.super_basic_ostream<char,_std::char_traits<char>_>,
                        (string *)&local_1c8);
        goto LAB_00ed52ea;
      }
      if (iVar2 - 0x23U < 4) {
        pcVar7 = "false";
        if (this[uVar6 + 4] != (Functional)0x0) {
          pcVar7 = "true";
        }
        std::operator<<(&result.super_basic_ostream<char,_std::char_traits<char>_>,pcVar7);
        uVar4 = extraout_RDX_02;
      }
      else if (iVar2 - 0x27U < 0x1e) {
        std::ostream::operator<<(&result,*(int *)(this + 4));
        uVar4 = extraout_RDX_03;
      }
    }
    uVar6 = uVar6 + 1;
    lVar8 = lVar8 + 4;
  } while( true );
}

Assistant:

static string apiVarValueStr (const VarValue& value)
{
	const int			numElems = glu::getDataTypeScalarSize(value.type);
	std::ostringstream	result;

	if (numElems > 1)
		result << "(";

	for (int i = 0; i < numElems; i++)
	{
		if (i > 0)
			result << ", ";

		if (glu::isDataTypeFloatOrVec(value.type) || glu::isDataTypeMatrix(value.type))
			result << de::floatToString(value.val.floatV[i], 2);
		else if (glu::isDataTypeIntOrIVec((value.type)))
			result << de::toString(value.val.intV[i]);
		else if (glu::isDataTypeBoolOrBVec((value.type)))
			result << (value.val.boolV[i] ? "true" : "false");
		else if (glu::isDataTypeSampler((value.type)))
			result << value.val.samplerV.unit;
		else
			DE_ASSERT(false);
	}

	if (numElems > 1)
		result << ")";

	return result.str();
}